

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O2

ImmutableSamplerDesc * __thiscall
Diligent::FixedLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
          (FixedLinearAllocator *this,size_t count)

{
  ImmutableSamplerDesc *pIVar1;
  ImmutableSamplerDesc *this_00;
  bool bVar2;
  
  pIVar1 = Allocate<Diligent::ImmutableSamplerDesc>(this,count);
  this_00 = pIVar1;
  while (bVar2 = count != 0, count = count - 1, bVar2) {
    ImmutableSamplerDesc::ImmutableSamplerDesc(this_00);
    this_00 = this_00 + 1;
  }
  return pIVar1;
}

Assistant:

NODISCARD T* ConstructArray(size_t count, const Args&... args)
    {
        T* Ptr = Allocate<T>(count);
        for (size_t i = 0; i < count; ++i)
        {
            new (Ptr + i) T{args...};
        }
        return Ptr;
    }